

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int push_change_cipher_spec(ptls_t *tls,ptls_message_emitter_t *emitter)

{
  uint8_t *puVar1;
  ptls_buffer_t *ppVar2;
  uint8_t *puVar3;
  size_t sVar4;
  int iVar5;
  ulong uVar6;
  
  iVar5 = 0;
  if (((tls->field_0x1e8 & 4) != 0) && (iVar5 = 10, emitter->begin_message == begin_record_message))
  {
    ppVar2 = emitter->buf;
    iVar5 = ptls_buffer_reserve_aligned(ppVar2,3,'\0');
    if (iVar5 == 0) {
      puVar3 = ppVar2->base;
      sVar4 = ppVar2->off;
      puVar1 = puVar3 + sVar4;
      puVar1[0] = '\x14';
      puVar1[1] = '\x03';
      puVar3[sVar4 + 2] = '\x03';
      ppVar2->off = ppVar2->off + 3;
      ppVar2 = emitter->buf;
      iVar5 = ptls_buffer_reserve_aligned(ppVar2,2,'\0');
      if (iVar5 == 0) {
        puVar1 = ppVar2->base;
        sVar4 = ppVar2->off;
        (puVar1 + sVar4)[0] = '\0';
        (puVar1 + sVar4)[1] = '\0';
        ppVar2->off = ppVar2->off + 2;
        ppVar2 = emitter->buf;
        sVar4 = ppVar2->off;
        iVar5 = ptls_buffer_reserve_aligned(ppVar2,1,'\0');
        if (iVar5 == 0) {
          ppVar2->base[ppVar2->off] = '\x01';
          ppVar2->off = ppVar2->off + 1;
          uVar6 = emitter->buf->off - sVar4;
          iVar5 = 0x20c;
          if (uVar6 < 0x10000) {
            emitter->buf->base[sVar4 - 2] = (uint8_t)(uVar6 >> 8);
            emitter->buf->base[sVar4 - 1] = (uint8_t)uVar6;
            tls->field_0x1e8 = tls->field_0x1e8 & 0xfb;
            iVar5 = 0;
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

static int push_change_cipher_spec(ptls_t *tls, ptls_message_emitter_t *emitter)
{
    int ret;

    /* check if we are requested to (or still need to) */
    if (!tls->send_change_cipher_spec) {
        ret = 0;
        goto Exit;
    }

    /* CCS is a record, can only be sent when using a record-based protocol. */
    if (emitter->begin_message != begin_record_message) {
        ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        goto Exit;
    }

    /* emit CCS */
    buffer_push_record(emitter->buf, PTLS_CONTENT_TYPE_CHANGE_CIPHER_SPEC, { ptls_buffer_push(emitter->buf, 1); });

    tls->send_change_cipher_spec = 0;
    ret = 0;
Exit:
    return ret;
}